

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O0

void __thiscall Strategy::~Strategy(Strategy *this)

{
  code *pcVar1;
  Strategy *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Strategy::~Strategy() {
	if (m_fout.is_open())
		m_fout.close();

	if (m_a)
		delete m_a;

	if (m_b)
		delete m_b;

	if (m_config.instrs)
		Instruction::clear();
}